

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O3

void DestroyVocab(void)

{
  void *pvVar1;
  vocab_word *pvVar2;
  long lVar3;
  long lVar4;
  
  pvVar2 = vocab;
  if (0 < vocab_size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      pvVar1 = *(void **)((long)&pvVar2->word + lVar3);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        pvVar2 = vocab;
      }
      pvVar1 = *(void **)((long)&pvVar2->code + lVar3);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        pvVar2 = vocab;
      }
      pvVar1 = *(void **)((long)&pvVar2->point + lVar3);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        pvVar2 = vocab;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x28;
    } while (lVar4 < vocab_size);
  }
  free(pvVar2[vocab_size].word);
  free(vocab);
  return;
}

Assistant:

void DestroyVocab() {
  int a;

  for (a = 0; a < vocab_size; a++) {
    if (vocab[a].word != NULL) {
      free(vocab[a].word);
    }
    if (vocab[a].code != NULL) {
      free(vocab[a].code);
    }
    if (vocab[a].point != NULL) {
      free(vocab[a].point);
    }
  }
  free(vocab[vocab_size].word);
  free(vocab);
}